

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

bool CheckSkipOptionBlock(FScanner *sc)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  
  FScanner::MustGetStringName(sc,"(");
  bVar2 = 0;
  do {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"ReadThis");
    if (bVar1) {
      bVar3 = bVar2 | gameinfo.drawreadthis;
    }
    else {
      bVar1 = FScanner::Compare(sc,"Swapmenu");
      if (bVar1) {
        bVar3 = bVar2 | gameinfo.swapmenu;
      }
      else {
        bVar1 = FScanner::Compare(sc,"Windows");
        bVar3 = bVar2;
        if (!bVar1) {
          bVar1 = FScanner::Compare(sc,"unix");
          bVar3 = 1;
          if ((!bVar1) && (bVar1 = FScanner::Compare(sc,"Mac"), bVar3 = bVar2, !bVar1)) {
            bVar1 = FScanner::Compare(sc,"OpenAL");
            if (bVar1) {
              bVar1 = IsOpenALPresent();
            }
            else {
              bVar1 = FScanner::Compare(sc,"FModEx");
              if (!bVar1) goto LAB_0033372e;
              bVar1 = IsFModExPresent();
            }
            bVar3 = bVar2 | bVar1;
          }
        }
      }
    }
LAB_0033372e:
    bVar1 = FScanner::CheckString(sc,",");
    bVar2 = bVar3;
    if (!bVar1) {
      FScanner::MustGetStringName(sc,")");
      if ((bVar3 & 1) == 0) {
        SkipSubBlock(sc);
        bVar1 = FScanner::CheckString(sc,"else");
        bVar1 = !bVar1;
      }
      else {
        bVar1 = false;
      }
      return bVar1;
    }
  } while( true );
}

Assistant:

static bool CheckSkipOptionBlock(FScanner &sc)
{
	bool filter = false;
	sc.MustGetStringName("(");
	do
	{
		sc.MustGetString();
		if (sc.Compare("ReadThis")) filter |= gameinfo.drawreadthis;
		else if (sc.Compare("Swapmenu")) filter |= gameinfo.swapmenu;
		else if (sc.Compare("Windows"))
		{
			#ifdef _WIN32
				filter = true;
			#endif
		}
		else if (sc.Compare("unix"))
		{
			#ifdef __unix__
				filter = true;
			#endif
		}
		else if (sc.Compare("Mac"))
		{
			#ifdef __APPLE__
				filter = true;
			#endif
		}
		else if (sc.Compare("OpenAL"))
		{
			filter |= IsOpenALPresent();
		}
		else if (sc.Compare("FModEx"))
		{
			filter |= IsFModExPresent();
		}
	}
	while (sc.CheckString(","));
	sc.MustGetStringName(")");
	if (!filter)
	{
		SkipSubBlock(sc);
		return !sc.CheckString("else");
	}
	return false;
}